

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O2

void qt_QMetaEnum_flagDebugOperator<unsigned_long_long>
               (QDebug *debug,size_t sizeofT,unsigned_long_long value)

{
  long lVar1;
  QDebug *pQVar2;
  bool bVar3;
  size_t i;
  ulong uVar4;
  long in_FS_OFFSET;
  QDebugStateSaver saver;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  saver.d._M_t.
  super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>.
  super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl =
       (unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&saver,debug);
  QDebug::resetFormat(debug);
  debug->stream->space = false;
  pQVar2 = QDebug::operator<<(debug,"QFlags(");
  Qt::hex(&pQVar2->stream->ts);
  Qt::showbase(&pQVar2->stream->ts);
  bVar3 = false;
  for (uVar4 = 0; sizeofT << 3 != uVar4; uVar4 = uVar4 + 1) {
    if ((value >> (uVar4 & 0x3f) & 1) != 0) {
      if (bVar3) {
        QDebug::operator<<(debug,'|');
      }
      bVar3 = true;
      QDebug::operator<<(debug,1L << ((byte)uVar4 & 0x3f));
    }
  }
  QDebug::operator<<(debug,')');
  QDebugStateSaver::~QDebugStateSaver(&saver);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void qt_QMetaEnum_flagDebugOperator(QDebug &debug, size_t sizeofT, Int value)
{
    static_assert(std::is_unsigned_v<Int>,
            "Cast value to an unsigned type before calling this function");
    const QDebugStateSaver saver(debug);
    debug.resetFormat();
    debug.nospace() << "QFlags(" << Qt::hex << Qt::showbase;
    bool needSeparator = false;
    for (size_t i = 0; i < sizeofT * 8; ++i) {
        if (value & (Int(1) << i)) {
            if (needSeparator)
                debug << '|';
            else
                needSeparator = true;
            debug << (Int(1) << i);
        }
    }
    debug << ')';
}